

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no-prefix-set.cpp
# Opt level: O3

bool __thiscall Trie<char,_10UL,_'a'>::good(Trie<char,_10UL,__a_> *this,string *word)

{
  Trie<char,_10UL,__a_> **ppTVar1;
  size_type sVar2;
  size_t sVar3;
  Trie<char,_10UL,__a_> *pTVar4;
  size_type sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  sVar2 = word->_M_string_length;
  if (sVar2 == 0) {
    sVar3 = this->counter + 1;
  }
  else {
    sVar5 = 0;
    pTVar4 = this;
    do {
      lVar6 = (long)(word->_M_dataplus)._M_p[sVar5];
      this = *(Trie<char,_10UL,__a_> **)((long)pTVar4 + lVar6 * 8 + -0x308);
      if (this == (Trie<char,_10UL,__a_> *)0x0) {
        this = (Trie<char,_10UL,__a_> *)operator_new(0x58);
        this->nodes[0] = (Trie<char,_10UL,__a_> *)0x0;
        this->nodes[1] = (Trie<char,_10UL,__a_> *)0x0;
        this->nodes[2] = (Trie<char,_10UL,__a_> *)0x0;
        this->nodes[3] = (Trie<char,_10UL,__a_> *)0x0;
        this->nodes[4] = (Trie<char,_10UL,__a_> *)0x0;
        this->nodes[5] = (Trie<char,_10UL,__a_> *)0x0;
        this->nodes[6] = (Trie<char,_10UL,__a_> *)0x0;
        this->nodes[7] = (Trie<char,_10UL,__a_> *)0x0;
        this->nodes[8] = (Trie<char,_10UL,__a_> *)0x0;
        this->nodes[9] = (Trie<char,_10UL,__a_> *)0x0;
        this->counter = 0;
        *(Trie<char,_10UL,__a_> **)((long)pTVar4 + lVar6 * 8 + -0x308) = this;
      }
      if (this->counter != 0) {
        return false;
      }
      sVar5 = sVar5 + 1;
      pTVar4 = this;
    } while (sVar2 != sVar5);
    sVar3 = 1;
  }
  this->counter = sVar3;
  lVar6 = 0;
  lVar7 = 0;
  lVar8 = 0;
  do {
    ppTVar1 = this->nodes + lVar6;
    auVar9._0_4_ = -(uint)(*(int *)ppTVar1 == 0);
    auVar9._4_4_ = -(uint)(*(int *)((long)ppTVar1 + 4) == 0);
    auVar9._8_4_ = -(uint)(*(int *)(ppTVar1 + 1) == 0);
    auVar9._12_4_ = -(uint)(*(int *)((long)ppTVar1 + 0xc) == 0);
    auVar10._4_4_ = auVar9._0_4_;
    auVar10._0_4_ = auVar9._4_4_;
    auVar10._8_4_ = auVar9._12_4_;
    auVar10._12_4_ = auVar9._8_4_;
    lVar7 = lVar7 - SUB168(auVar10 & auVar9,0);
    lVar8 = lVar8 - SUB168(auVar10 & auVar9,8);
    lVar6 = lVar6 + 2;
  } while (lVar6 != 10);
  return lVar8 + lVar7 == 10;
}

Assistant:

bool good(const std::string &word) {
    auto root = this;
    for (auto i = 0; i < word.size(); ++i) {
      auto index = word[i] - offset;
      if (root->nodes[index] == nullptr) {
        root->nodes[index] = new Trie<Element, N, offset>();
      }
      root = root->nodes[index];
      if (root->counter != 0) {
        return false;
      }
    }
    root->counter += 1;
    return std::count(root->nodes, root->nodes + N, nullptr) == N;
  }